

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O3

void __thiscall vigra::BmpDecoder::~BmpDecoder(BmpDecoder *this)

{
  BmpDecoderImpl *this_00;
  void *pvVar1;
  pointer pvVar2;
  
  (this->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__BmpDecoder_0015b710;
  this_00 = this->pimpl;
  if (this_00 != (BmpDecoderImpl *)0x0) {
    pvVar1 = (this_00->map).super_void_vector_base.m_data;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = (this_00->pixels).super_void_vector_base.m_data;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    std::ifstream::~ifstream(this_00);
  }
  operator_delete(this_00);
  (this->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__Decoder_0015b938;
  pvVar2 = (this->super_Decoder).iccProfile_.super_ArrayVectorView<unsigned_char>.data_;
  if (pvVar2 != (pointer)0x0) {
    operator_delete(pvVar2);
    return;
  }
  return;
}

Assistant:

BmpDecoder::~BmpDecoder()
{
    delete pimpl;
}